

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

DVector2 __thiscall AActor::Vec2To(AActor *this,AActor *other)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  double dVar3;
  double dVar4;
  DVector2 DVar5;
  
  iVar2 = *(int *)(*(long *)(in_RDX + 0x130) + 0x208);
  iVar1 = other->Sector->PortalGroup;
  dVar3 = 0.0;
  dVar4 = 0.0;
  if (iVar2 != iVar1) {
    iVar2 = iVar1 * Displacements.size + iVar2;
    dVar3 = Displacements.data.Array[iVar2].pos.X;
    dVar4 = Displacements.data.Array[iVar2].pos.Y;
  }
  DVar5.X = (_func_int **)((*(double *)(in_RDX + 0x48) + dVar3) - (other->__Pos).X);
  DVar5.Y = (PClass *)((*(double *)(in_RDX + 0x50) + dVar4) - (other->__Pos).Y);
  (this->super_DThinker).super_DObject._vptr_DObject = DVar5.X;
  (this->super_DThinker).super_DObject.Class = DVar5.Y;
  return DVar5;
}

Assistant:

DVector2 Vec2To(AActor *other) const
	{
		return other->PosRelative(this) - Pos();
	}